

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation_p.h
# Opt level: O1

void __thiscall
QNetworkInformationBackend::setBehindCaptivePortal
          (QNetworkInformationBackend *this,bool behindPortal)

{
  QNetworkInformationBackend *pQVar1;
  QDeadlineTimer QVar2;
  
  pQVar1 = this + 0x10;
  QVar2.t2 = 0xffffffff;
  QVar2.type = 0x7fffffff;
  QVar2.t1 = (qint64)pQVar1;
  QReadWriteLock::tryLockForWrite(QVar2);
  if (this[0x20] == (QNetworkInformationBackend)behindPortal) {
    pQVar1 = this + 0x11;
  }
  else {
    this[0x20] = (QNetworkInformationBackend)behindPortal;
    QReadWriteLock::unlock();
    QNetworkInformationBackend::behindCaptivePortalChanged(SUB81(this,0));
  }
  if (((ulong)pQVar1 & 1) == 0) {
    return;
  }
  QReadWriteLock::unlock();
  return;
}

Assistant:

void setBehindCaptivePortal(bool behindPortal)
    {
        QWriteLocker locker(&m_lock);
        if (m_behindCaptivePortal != behindPortal) {
            m_behindCaptivePortal = behindPortal;
            locker.unlock();
            emit behindCaptivePortalChanged(behindPortal);
        }
    }